

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr)

{
  Vdbe *p;
  Select *p_00;
  sqlite3 *db;
  int iVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  u8 uVar4;
  int iVar5;
  char *pcVar6;
  Op *pOVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined1 local_78 [12];
  undefined8 uStack_6c;
  undefined4 uStack_64;
  char *pcStack_60;
  ExprList *local_58;
  Token local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0;
  if (pParse->nErr == 0) {
    p = pParse->pVdbe;
    local_58 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_64 = 0xaaaaaaaa;
    pcStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_4_ = 0xaaaaaaaa;
    local_78._4_4_ = -0x55555556;
    local_78._8_4_ = -0x55555556;
    uStack_6c = &DAT_aaaaaaaaaaaaaaaa;
    p_00 = (pExpr->x).pSelect;
    if ((pExpr->flags >> 0x19 & 1) == 0) {
      pExpr->flags = pExpr->flags | 0x2000000;
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
      (pExpr->y).sub.regReturn = iVar5;
      iVar1 = 0;
      iVar5 = sqlite3VdbeAddOp3(p,0x4a,0,iVar5,0);
      (pExpr->y).sub.iAddr = iVar5 + 1;
      if ((pExpr->flags & 0x40) == 0) {
        iVar1 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
      }
      pcVar6 = "";
      if (iVar1 == 0) {
        pcVar6 = "CORRELATED ";
      }
      iVar5 = 1;
      sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY %d",pcVar6,(ulong)p_00->selId);
      uVar4 = pExpr->op;
      if (uVar4 == 0x8b) {
        iVar5 = p_00->pEList->nExpr;
      }
      local_78._4_4_ = pParse->nMem + 1;
      iVar8 = pParse->nMem + iVar5;
      local_78._8_4_ = 0;
      pcStack_60 = (char *)0x0;
      uStack_6c = (undefined1 *)0x0;
      pParse->nMem = iVar8;
      if (uVar4 == 0x8b) {
        uStack_6c = (undefined1 *)CONCAT44(iVar5,local_78._4_4_);
        sqlite3VdbeAddOp3(p,0x4b,0,local_78._4_4_,iVar8);
        uVar4 = '\n';
      }
      else {
        sqlite3VdbeAddOp3(p,0x47,0,local_78._4_4_,0);
        uVar4 = '\x03';
      }
      local_78[0] = uVar4;
      db = pParse->db;
      if (p_00->pLimit == (Expr *)0x0) {
        local_48.n = 1;
        local_48._12_4_ = 0xaaaaaaaa;
        local_48.z = "1";
        pEVar2 = sqlite3ExprAlloc(db,0x9c,&local_48,0);
        pEVar2 = sqlite3PExpr(pParse,0x95,pEVar2,(Expr *)0x0);
        p_00->pLimit = pEVar2;
      }
      else {
        local_48.n = 1;
        local_48._12_4_ = 0xaaaaaaaa;
        local_48.z = "0";
        pEVar3 = (Expr *)0x0;
        pEVar2 = sqlite3ExprAlloc(db,0x9c,&local_48,0);
        if (pEVar2 != (Expr *)0x0) {
          pEVar2->affExpr = 'C';
          pEVar3 = p_00->pLimit->pLeft;
          if (pEVar3 == (Expr *)0x0) {
            pEVar3 = (Expr *)0x0;
          }
          else {
            pEVar3 = exprDup(db,pEVar3,0,(EdupBuf *)0x0);
          }
          pEVar3 = sqlite3PExpr(pParse,0x35,pEVar3,pEVar2);
        }
        sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,p_00->pLimit->pLeft);
        p_00->pLimit->pLeft = pEVar3;
      }
      p_00->iLimit = 0;
      iVar8 = sqlite3Select(pParse,p_00,(SelectDest *)local_78);
      iVar5 = local_78._4_4_;
      if (iVar8 == 0) {
        pExpr->iTable = local_78._4_4_;
        if (iVar1 != 0) {
          if (p->db->mallocFailed == '\0') {
            pOVar7 = p->aOp + iVar1;
          }
          else {
            pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar7->p2 = p->nOp;
        }
        sqlite3VdbeAddOp3(p,0x43,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,1);
        pParse->nTempReg = '\0';
        pParse->nRangeReg = 0;
      }
      else {
        pExpr->op2 = pExpr->op;
        pExpr->op = 0xb6;
        iVar5 = 0;
      }
    }
    else {
      sqlite3VdbeExplain(pParse,'\0',"REUSE SUBQUERY %d",(ulong)p_00->selId);
      sqlite3VdbeAddOp3(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,0);
      iVar5 = pExpr->iTable;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(Parse *pParse, Expr *pExpr){
  int addrOnce = 0;           /* Address of OP_Once at top of subroutine */
  int rReg = 0;               /* Register storing resulting */
  Select *pSel;               /* SELECT statement to encode */
  SelectDest dest;            /* How to deal with SELECT result */
  int nReg;                   /* Registers to allocate */
  Expr *pLimit;               /* New limit expression */
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExplain;            /* Address of OP_Explain instruction */
#endif

  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  if( pParse->nErr ) return 0;
  testcase( pExpr->op==TK_EXISTS );
  testcase( pExpr->op==TK_SELECT );
  assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
  assert( ExprUseXSelect(pExpr) );
  pSel = pExpr->x.pSelect;

  /* If this routine has already been coded, then invoke it as a
  ** subroutine. */
  if( ExprHasProperty(pExpr, EP_Subrtn) ){
    ExplainQueryPlan((pParse, 0, "REUSE SUBQUERY %d", pSel->selId));
    assert( ExprUseYSub(pExpr) );
    sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr);
    return pExpr->iTable;
  }

  /* Begin coding the subroutine */
  assert( !ExprUseYWin(pExpr) );
  assert( !ExprHasProperty(pExpr, EP_Reduced|EP_TokenOnly) );
  ExprSetProperty(pExpr, EP_Subrtn);
  pExpr->y.sub.regReturn = ++pParse->nMem;
  pExpr->y.sub.iAddr =
    sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;

  /* The evaluation of the EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* For a SELECT, generate code to put the values for all columns of
  ** the first row into an array of registers and return the index of
  ** the first register.
  **
  ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
  ** into a register and return that register number.
  **
  ** In both cases, the query is augmented with "LIMIT 1".  Any
  ** preexisting limit is discarded in place of the new LIMIT 1.
  */
  ExplainQueryPlan2(addrExplain, (pParse, 1, "%sSCALAR SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSel->selId));
  sqlite3VdbeScanStatusCounters(v, addrExplain, addrExplain, -1);
  nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
  sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
  pParse->nMem += nReg;
  if( pExpr->op==TK_SELECT ){
    dest.eDest = SRT_Mem;
    dest.iSdst = dest.iSDParm;
    dest.nSdst = nReg;
    sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
    VdbeComment((v, "Init subquery result"));
  }else{
    dest.eDest = SRT_Exists;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
    VdbeComment((v, "Init EXISTS result"));
  }
  if( pSel->pLimit ){
    /* The subquery already has a limit.  If the pre-existing limit is X
    ** then make the new limit X<>0 so that the new limit is either 1 or 0 */
    sqlite3 *db = pParse->db;
    pLimit = sqlite3Expr(db, TK_INTEGER, "0");
    if( pLimit ){
      pLimit->affExpr = SQLITE_AFF_NUMERIC;
      pLimit = sqlite3PExpr(pParse, TK_NE,
                            sqlite3ExprDup(db, pSel->pLimit->pLeft, 0), pLimit);
    }
    sqlite3ExprDeferredDelete(pParse, pSel->pLimit->pLeft);
    pSel->pLimit->pLeft = pLimit;
  }else{
    /* If there is no pre-existing limit add a limit of 1 */
    pLimit = sqlite3Expr(pParse->db, TK_INTEGER, "1");
    pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
  }
  pSel->iLimit = 0;
  if( sqlite3Select(pParse, pSel, &dest) ){
    pExpr->op2 = pExpr->op;
    pExpr->op = TK_ERROR;
    return 0;
  }
  pExpr->iTable = rReg = dest.iSDParm;
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  if( addrOnce ){
    sqlite3VdbeJumpHere(v, addrOnce);
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, addrExplain, -1);

  /* Subroutine return */
  assert( ExprUseYSub(pExpr) );
  assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
          || pParse->nErr );
  sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                    pExpr->y.sub.iAddr, 1);
  VdbeCoverage(v);
  sqlite3ClearTempRegCache(pParse);
  return rReg;
}